

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.cpp
# Opt level: O0

void out_CreatePatch(uint32_t type,Expression *expr,uint32_t ofs,uint32_t pcShift)

{
  Patch *pPVar1;
  Patch *patch;
  uint32_t pcShift_local;
  uint32_t ofs_local;
  Expression *expr_local;
  uint32_t type_local;
  
  pPVar1 = allocpatch(type,expr,ofs);
  pPVar1->pcOffset = pPVar1->pcOffset - pcShift;
  pPVar1->next = currentSection->patches;
  currentSection->patches = pPVar1;
  return;
}

Assistant:

void out_CreatePatch(uint32_t type, struct Expression const *expr, uint32_t ofs, uint32_t pcShift)
{
	struct Patch *patch = allocpatch(type, expr, ofs);

	// If the patch had a quantity of bytes output before it,
	// PC is not at the patch's location, but at the location
	// before those bytes.
	patch->pcOffset -= pcShift;

	patch->next = currentSection->patches;
	currentSection->patches = patch;
}